

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O3

void __thiscall gui::Group::handleMouseWheelScroll(Group *this)

{
  Vector2f *in_RDX;
  Wheel in_ESI;
  float in_XMM0_Da;
  
  handleMouseWheelScroll
            ((Group *)((long)&this[-1].super_Container.super_Widget.name_.m_string.field_2 + 8),
             in_ESI,in_XMM0_Da,in_RDX);
  return;
}

Assistant:

bool Group::handleMouseWheelScroll(sf::Mouse::Wheel wheel, float delta, const sf::Vector2f& mouseParent) {
    auto mouseLocal = toLocalSpace(mouseParent);
    auto widget = getWidgetUnderMouse(mouseLocal);
    if (widget == nullptr || !widget->handleMouseWheelScroll(wheel, delta, mouseLocal)) {
        return baseClass::handleMouseWheelScroll(wheel, delta, mouseParent);
    } else {
        return true;
    }
}